

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscreteParameters.cpp
# Opt level: O1

void __thiscall PlanningUnitMADPDiscreteParameters::Print(PlanningUnitMADPDiscreteParameters *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ComputeIndividualObservationHistories: ",0x27);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ComputeIndividualActionHistories: ",0x22);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ComputeIndividualActionObservationHistories: ",0x2d);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ComputeJointObservationHistories: ",0x22);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ComputeJointActionHistories: ",0x1d);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ComputeJointActionObservationHistories: ",0x28);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ComputeJointBeliefs: ",0x15);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"UseSparseJointBeliefs: ",0x17);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void PlanningUnitMADPDiscreteParameters::Print() const
{
    cout << "ComputeIndividualObservationHistories: "
         << GetComputeIndividualObservationHistories() << endl;

    cout << "ComputeIndividualActionHistories: "
         << GetComputeIndividualActionHistories() << endl;

    cout << "ComputeIndividualActionObservationHistories: "
         << GetComputeIndividualActionObservationHistories() << endl;

    cout << "ComputeJointObservationHistories: "
         << GetComputeJointObservationHistories() << endl;

    cout << "ComputeJointActionHistories: "
         << GetComputeJointActionHistories() << endl;

    cout << "ComputeJointActionObservationHistories: "
         << GetComputeJointActionObservationHistories() << endl;

    cout << "ComputeJointBeliefs: "
         << GetComputeJointBeliefs() << endl;

    cout << "UseSparseJointBeliefs: "
         << GetUseSparseJointBeliefs() << endl;
}